

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

double __thiscall
SnareDrumOperator::getOperatorOutput(SnareDrumOperator *this,OPL3 *OPL3,double modulator)

{
  int iVar1;
  double (*padVar2) [1024];
  double dVar3;
  double dVar4;
  double dVar5;
  double noise;
  double operatorOutput;
  double *waveform;
  int waveIndex;
  double envelopeInDB;
  double modulator_local;
  OPL3 *OPL3_local;
  SnareDrumOperator *this_local;
  
  if ((this->super_Operator).envelopeGenerator.stage == OFF) {
    this_local = (SnareDrumOperator *)0x0;
  }
  else {
    dVar3 = EnvelopeGenerator::getEnvelope
                      (&(this->super_Operator).envelopeGenerator,OPL3,(this->super_Operator).egt,
                       (this->super_Operator).am);
    dVar3 = EnvelopeFromDB(dVar3);
    (this->super_Operator).envelope = dVar3;
    iVar1 = OPL3->_new;
    padVar2 = ::OPL3::OperatorData->waveforms;
    (this->super_Operator).phase =
         (OPL3->highHatOperator).super_TopCymbalOperator.super_Operator.phase * 2.0;
    dVar3 = Operator::getOutput(&this->super_Operator,modulator,(this->super_Operator).phase,
                                padVar2[(int)((this->super_Operator).ws & iVar1 * 4 + 3U)]);
    dVar4 = FRandom::GenRand_Real1(&pr_opl3);
    dVar4 = dVar4 * (this->super_Operator).envelope;
    dVar5 = dVar3 / (this->super_Operator).envelope;
    noise = dVar3;
    if ((((dVar5 != 1.0) || (NAN(dVar5))) &&
        ((dVar5 = dVar3 / (this->super_Operator).envelope, dVar5 != -1.0 || (NAN(dVar5))))) &&
       (noise = dVar4, dVar3 <= 0.0)) {
      if (0.0 <= dVar3) {
        noise = 0.0;
      }
      else {
        noise = -dVar4;
      }
    }
    this_local = (SnareDrumOperator *)(noise * 2.0);
  }
  return (double)this_local;
}

Assistant:

double SnareDrumOperator::getOperatorOutput(OPL3 *OPL3, double modulator) {
	if(envelopeGenerator.stage == EnvelopeGenerator::OFF) return 0;
	
	double envelopeInDB = envelopeGenerator.getEnvelope(OPL3, egt, am);
	envelope = EnvelopeFromDB(envelopeInDB);
	
	// If it is in OPL2 mode, use first four waveforms only:
	int waveIndex = ws & ((OPL3->_new<<2) + 3); 
	double *waveform = OPL3::OperatorData->waveforms[waveIndex];
	
	phase = OPL3->highHatOperator.phase * 2;
	
	double operatorOutput = getOutput(modulator, phase, waveform);

	double noise = pr_opl3.GenRand_Real1() * envelope;        
	
	if(operatorOutput/envelope != 1 && operatorOutput/envelope != -1) {
		if(operatorOutput > 0)  operatorOutput = noise;
		else if(operatorOutput < 0) operatorOutput = -noise;
		else operatorOutput = 0;            
	}
	
	return operatorOutput*2;
}